

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall spv::Builder::makeIntegerType(Builder *this,int width,bool hasSign)

{
  unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
  *this_00;
  ulong uVar1;
  pointer puVar2;
  iterator __position;
  Id IVar3;
  mapped_type *pmVar4;
  Instruction *pIVar5;
  vector<spv::Instruction*,std::allocator<spv::Instruction*>> *this_01;
  mapped_type_conflict *pmVar6;
  long lVar7;
  Instruction *local_40;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  
  this_00 = &this->groupedTypes;
  local_40 = (Instruction *)CONCAT44(local_40._4_4_,0x15);
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,(key_type *)&local_40);
  if (0 < (int)((ulong)((long)(pmVar4->
                              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pmVar4->
                             super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    lVar7 = 0;
    do {
      local_40._0_4_ = 0x15;
      pmVar4 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)&local_40);
      pIVar5 = (pmVar4->super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>)
               ._M_impl.super__Vector_impl_data._M_start[lVar7];
      uVar1 = *(pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      if ((uVar1 & 1) != 0) {
LAB_003cd732:
        __assert_fail("!idOperand[op]",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                      ,0xa5,"unsigned int spv::Instruction::getImmediateOperand(int) const");
      }
      puVar2 = (pIVar5->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (*puVar2 == width) {
        if ((uVar1 & 2) != 0) goto LAB_003cd732;
        if (puVar2[1] == (uint)hasSign) goto LAB_003cd720;
      }
      lVar7 = lVar7 + 1;
      local_40 = (Instruction *)CONCAT44(local_40._4_4_,0x15);
      pmVar4 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)&local_40);
    } while (lVar7 < (int)((ulong)((long)(pmVar4->
                                         super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pmVar4->
                                        super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  pIVar5 = (Instruction *)operator_new(0x60);
  IVar3 = this->uniqueId + 1;
  this->uniqueId = IVar3;
  pIVar5->_vptr_Instruction = (_func_int **)&PTR__Instruction_00927e68;
  pIVar5->resultId = IVar3;
  pIVar5->typeId = 0;
  pIVar5->opCode = OpTypeInt;
  (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (pIVar5->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar5->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar5->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  pIVar5->block = (Block *)0x0;
  local_40 = pIVar5;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&pIVar5->operands,2);
  if ((pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage ==
      (pIVar5->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) {
    std::vector<bool,_std::allocator<bool>_>::_M_reallocate(&pIVar5->idOperand,2);
  }
  Instruction::addImmediateOperand(pIVar5,width);
  Instruction::addImmediateOperand(pIVar5,(uint)hasSign);
  local_38._M_head_impl._0_4_ = 0x15;
  this_01 = (vector<spv::Instruction*,std::allocator<spv::Instruction*>> *)
            std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this_00,(key_type *)&local_38);
  __position._M_current = *(Instruction ***)(this_01 + 8);
  if (__position._M_current == *(Instruction ***)(this_01 + 0x10)) {
    std::vector<spv::Instruction*,std::allocator<spv::Instruction*>>::
    _M_realloc_insert<spv::Instruction*const&>(this_01,__position,&local_40);
    local_38._M_head_impl = local_40;
  }
  else {
    *__position._M_current = pIVar5;
    *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
    local_38._M_head_impl = pIVar5;
  }
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_38);
  if (local_38._M_head_impl != (Instruction *)0x0) {
    (*(local_38._M_head_impl)->_vptr_Instruction[1])();
  }
  Module::mapInstruction(&this->module,local_40);
  if (width == 0x40) {
    local_38._M_head_impl._0_4_ = 0xb;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                *)&this->capabilities,(Capability *)&local_38);
  }
  pIVar5 = local_40;
  if (this->emitNonSemanticShaderDebugInfo == true) {
    IVar3 = makeIntegerDebugType(this,width,hasSign);
    local_38._M_head_impl._0_4_ = local_40->resultId;
    pmVar6 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->debugId,(key_type *)&local_38);
    *pmVar6 = IVar3;
    pIVar5 = local_40;
  }
LAB_003cd720:
  return pIVar5->resultId;
}

Assistant:

Id Builder::makeIntegerType(int width, bool hasSign)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeInt].size(); ++t) {
        type = groupedTypes[OpTypeInt][t];
        if (type->getImmediateOperand(0) == (unsigned)width &&
            type->getImmediateOperand(1) == (hasSign ? 1u : 0u))
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypeInt);
    type->reserveOperands(2);
    type->addImmediateOperand(width);
    type->addImmediateOperand(hasSign ? 1 : 0);
    groupedTypes[OpTypeInt].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    // deal with capabilities
    switch (width) {
    case 8:
    case 16:
        // these are currently handled by storage-type declarations and post processing
        break;
    case 64:
        addCapability(CapabilityInt64);
        break;
    default:
        break;
    }

    if (emitNonSemanticShaderDebugInfo)
    {
        auto const debugResultId = makeIntegerDebugType(width, hasSign);
        debugId[type->getResultId()] = debugResultId;
    }

    return type->getResultId();
}